

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O1

void __thiscall Inject::default_impl_override::test_method(default_impl_override *this)

{
  int iVar1;
  ptr_type *ppVar2;
  undefined4 extraout_var;
  component<Inject::impl2> z;
  component<Inject::impl1> y;
  implemented_by<Inject::impl1,_(inject::component_scope)0> xx;
  component<Inject::service> x;
  injected<Inject::service> actual;
  undefined **local_170;
  undefined1 local_168;
  _Base_ptr local_160;
  _Base_ptr local_158;
  _Base_ptr local_150;
  _Base_ptr local_148;
  provides<Inject::service> zz;
  provides<Inject::service> yy;
  _Base_ptr local_130;
  _Base_ptr local_128;
  undefined1 local_120 [8];
  context<0> *local_118;
  shared_count sStack_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  context<0> c;
  undefined **local_68;
  undefined1 local_60;
  undefined8 *local_58;
  _Base_ptr *local_50;
  undefined **local_48;
  undefined1 local_40;
  undefined8 *local_38;
  _Base_ptr *local_30;
  
  inject::context<0>::component<Inject::service>::component(&x);
  inject::context<0>::component<Inject::service>::
  implemented_by<Inject::impl1,_(inject::component_scope)0>::implemented_by(&xx);
  inject::context<0>::component<Inject::impl1>::component(&y);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides(&yy);
  inject::context<0>::component<Inject::impl2>::component(&z);
  inject::context<0>::component<Inject::impl2>::provides<Inject::service>::provides(&zz);
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._bindings._M_t._M_impl.super__Rb_tree_header._M_header;
  c._vptr_context = (_func_int **)&PTR__context_00163e10;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._singletons._M_t._M_impl.super__Rb_tree_header._M_header;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._parent = inject::context<0>::head()::_head;
  inject::context<0>::head()::_head = &c;
  inject::context<0>::current()::_current = inject::context<0>::head()::_head;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  inject::context<0>::bind<Inject::service,Inject::impl2,(inject::component_scope)0>
            (inject::context<0>::head()::_head);
  inject::context<0>::get_current();
  inject::context<0>::instance<Inject::service>((context<0> *)&actual);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f8,0x13f);
  local_168 = 0;
  local_170 = &PTR__lazy_ostream_00163f10;
  local_160 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_158 = (_Base_ptr)0x152778;
  ppVar2 = inject::context<0>::injected<Inject::service>::ptr(&actual);
  iVar1 = (**ppVar2->px->_vptr_service)();
  local_148 = (_Base_ptr)CONCAT44(extraout_var,iVar1);
  local_150 = (_Base_ptr)inject::id_of<Inject::impl2>::id();
  local_130 = (_Base_ptr)&local_150;
  local_120[0] = local_148 == local_150;
  local_118 = (context<0> *)0x0;
  sStack_110.pi_ = (sp_counted_base *)0x0;
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_e0 = "";
  local_30 = &local_128;
  local_40 = 0;
  local_48 = &PTR__lazy_ostream_00163f88;
  local_38 = &boost::unit_test::lazy_ostream::inst;
  local_50 = &local_130;
  local_60 = 0;
  local_68 = &PTR__lazy_ostream_00163f88;
  local_58 = &boost::unit_test::lazy_ostream::inst;
  local_128 = (_Base_ptr)&local_148;
  boost::test_tools::tt_detail::report_assertion
            (local_120,&local_170,&local_e8,0x13f,1,2,2,"actual->id()",&local_48,
             "id_of<impl2>::id()",&local_68);
  boost::detail::shared_count::~shared_count(&sStack_110);
  boost::detail::shared_count::~shared_count(&actual._ptr.pn);
  c._vptr_context = (_func_int **)&PTR__context_00163e10;
  inject::context<0>::head()::_head = c._parent;
  inject::context<0>::current()::_current = c._parent;
  std::
  _Rb_tree<long,_std::pair<const_long,_boost::shared_ptr<void>_>,_std::_Select1st<std::pair<const_long,_boost::shared_ptr<void>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_boost::shared_ptr<void>_>_>_>
  ::~_Rb_tree(&c._singletons._M_t);
  std::
  _Rb_tree<long,_std::pair<const_long,_inject::binding>,_std::_Select1st<std::pair<const_long,_inject::binding>_>,_std::less<long>,_std::allocator<std::pair<const_long,_inject::binding>_>_>
  ::~_Rb_tree(&c._bindings._M_t);
  inject::context<0>::component<Inject::impl2>::~component(&z);
  inject::context<0>::component<Inject::impl1>::~component(&y);
  inject::context<0>::component<Inject::service>::
  implemented_by<Inject::impl1,_(inject::component_scope)0>::~implemented_by(&xx);
  inject::context<0>::component<Inject::service>::~component(&x);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(default_impl_override)
{
    context<>::component<service> x;
    context<>::component<service>::implemented_by<impl1> xx;

    context<>::component<impl1> y;
    context<>::component<impl1>::provides<service> yy;
    
    context<>::component<impl2> z;
    context<>::component<impl2>::provides<service> zz;

    context<> c;
    c.bind<service, impl2>();

    context<>::injected<service> actual;
    BOOST_CHECK_EQUAL(actual->id(), id_of<impl2>::id());
}